

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowLastValueExecutor::EvaluateInternal
          (WindowLastValueExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowExecutorLocalState *this_00;
  WindowExecutorLocalState *this_01;
  WindowExcludeMode WVar1;
  ulong uVar2;
  FrameBounds *frame;
  type this_02;
  ValidityMask *pVVar3;
  const_reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  WindowCursor *pWVar7;
  pointer pWVar8;
  idx_t row_idx_00;
  SubFrames *__range3;
  long lVar9;
  ulong uVar10;
  size_type sVar11;
  ulong uVar12;
  idx_t i;
  idx_t target_offset;
  ValidityMask **this_03;
  pair<unsigned_long,_unsigned_long> pVar13;
  idx_t local_68;
  data_ptr_t local_60;
  idx_t local_58;
  ValidityMask *local_50;
  data_ptr_t local_48;
  data_ptr_t local_40;
  data_ptr_t local_38;
  
  this_02 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
            operator*(&lstate[0x15].range_cursor);
  this_00 = lstate + 2;
  this_01 = lstate + 0x14;
  pVVar3 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                     ((optional_ptr<duckdb::ValidityMask,_true> *)&gstate[2].executor);
  WVar1 = gstate->executor->wexpr->exclude_clause;
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,6);
  local_38 = pvVar4->data;
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,7);
  local_40 = pvVar4->data;
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,2);
  local_60 = pvVar4->data;
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,3);
  local_48 = pvVar4->data;
  this_03 = &gstate[2].partition_mask;
  target_offset = 0;
  local_58 = count;
  local_50 = pVVar3;
  do {
    if (target_offset == count) {
      return;
    }
    uVar10 = *(ulong *)(local_38 + target_offset * 8);
    uVar2 = *(ulong *)(local_40 + target_offset * 8);
    if (WVar1 == NO_OTHER) {
      sVar11 = 0;
    }
    else {
      uVar6 = row_idx;
      if (WVar1 != CURRENT_ROW) {
        uVar6 = *(ulong *)(local_60 + target_offset * 8);
      }
      if (uVar2 <= uVar6) {
        uVar6 = uVar2;
      }
      if (uVar6 <= uVar10) {
        uVar6 = uVar10;
      }
      pvVar5 = vector<duckdb::FrameBounds,_true>::get<true>
                         ((vector<duckdb::FrameBounds,_true> *)this_01,0);
      pvVar5->start = uVar10;
      pvVar5->end = uVar6;
      if (WVar1 == TIES) {
        uVar6 = uVar10;
        if (uVar10 < row_idx) {
          uVar6 = row_idx;
        }
        if (uVar2 <= uVar6) {
          uVar6 = uVar2;
        }
        uVar12 = row_idx + 1;
        if (uVar2 <= row_idx + 1) {
          uVar12 = uVar2;
        }
        if (uVar12 <= uVar10) {
          uVar12 = uVar10;
        }
        pvVar5 = vector<duckdb::FrameBounds,_true>::get<true>
                           ((vector<duckdb::FrameBounds,_true> *)this_01,1);
        pvVar5->start = uVar6;
        pvVar5->end = uVar12;
        sVar11 = 2;
        count = local_58;
LAB_00a89645:
        uVar6 = *(ulong *)(local_48 + target_offset * 8);
      }
      else {
        sVar11 = 1;
        if (WVar1 != CURRENT_ROW) goto LAB_00a89645;
        uVar6 = row_idx + 1;
      }
      if (uVar10 < uVar6) {
        uVar10 = uVar6;
      }
      if (uVar2 <= uVar10) {
        uVar10 = uVar2;
      }
    }
    pvVar5 = vector<duckdb::FrameBounds,_true>::get<true>
                       ((vector<duckdb::FrameBounds,_true> *)this_01,sVar11);
    pVVar3 = local_50;
    pvVar5->start = uVar10;
    pvVar5->end = uVar2;
    if (*this_03 == (ValidityMask *)0x0) {
      sVar11 = (long)lstate[0x14].range_cursor.
                     super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
                     .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl -
               (long)lstate[0x14].super_WindowExecutorState._vptr_WindowExecutorState >> 4;
      do {
        do {
          sVar11 = sVar11 - 1;
          if (sVar11 == 0xffffffffffffffff) goto LAB_00a896de;
          pvVar5 = vector<duckdb::FrameBounds,_true>::get<true>
                             ((vector<duckdb::FrameBounds,_true> *)this_01,sVar11);
        } while (pvVar5->end <= pvVar5->start);
        local_68 = 1;
        row_idx_00 = WindowBoundariesState::FindPrevStart
                               (pVVar3,pvVar5->start,pvVar5->end,&local_68);
      } while (local_68 != 0);
LAB_00a8974f:
      WindowCursor::CopyCell(this_02,0,row_idx_00,result,target_offset);
    }
    else {
      lVar9 = 0;
      for (pWVar7 = (WindowCursor *)lstate[0x14].super_WindowExecutorState._vptr_WindowExecutorState
          ; pWVar7 != lstate[0x14].range_cursor.
                      super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
                      .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
          pWVar7 = (WindowCursor *)((long)&(pWVar7->state).current_chunk_state + 8)) {
        lVar9 = *(long *)&(pWVar7->state).current_chunk_state.handles +
                (lVar9 - (long)pWVar7->paged);
      }
      if (lVar9 != 0) {
        uVar10 = lVar9 + -1;
        pWVar8 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                 ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                               *)this_03);
        pVar13 = WindowIndexTree::SelectNth(pWVar8,(SubFrames *)this_01,uVar10);
        if (pVar13.second - 1 < uVar10) {
          pWVar8 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                   ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                                 *)this_03);
          pVar13 = WindowIndexTree::SelectNth(pWVar8,(SubFrames *)this_01,uVar10 - pVar13.second);
        }
        row_idx_00 = pVar13.first;
        if (pVar13.second == 0) goto LAB_00a8974f;
      }
LAB_00a896de:
      FlatVector::SetNull(result,target_offset,true);
    }
    target_offset = target_offset + 1;
    row_idx = row_idx + 1;
  } while( true );
}

Assistant:

void WindowLastValueExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                               DataChunk &eval_chunk, Vector &result, idx_t count,
                                               idx_t row_idx) const {
	auto &gvstate = gstate.Cast<WindowValueGlobalState>();
	auto &lvstate = lstate.Cast<WindowValueLocalState>();
	auto &cursor = *lvstate.cursor;
	auto &bounds = lvstate.bounds;
	auto &frames = lvstate.frames;
	auto &ignore_nulls = *gvstate.ignore_nulls;
	auto exclude_mode = gvstate.executor.wexpr.exclude_clause;
	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t i) {
		if (gvstate.value_tree) {
			idx_t frame_width = 0;
			for (const auto &frame : frames) {
				frame_width += frame.end - frame.start;
			}

			if (frame_width) {
				auto n = frame_width - 1;
				auto last_idx = gvstate.value_tree->SelectNth(frames, n);
				if (last_idx.second && last_idx.second <= n) {
					//	Frame larger than data. Since we want last, we back off by the overflow
					n -= last_idx.second;
					last_idx = gvstate.value_tree->SelectNth(frames, n);
				}
				if (last_idx.second) {
					//	No last value - give up.
					FlatVector::SetNull(result, i, true);
				} else {
					cursor.CopyCell(0, last_idx.first, result, i);
				}
			} else {
				FlatVector::SetNull(result, i, true);
			}
			return;
		}

		for (idx_t f = frames.size(); f-- > 0;) {
			const auto &frame = frames[f];
			if (frame.start >= frame.end) {
				continue;
			}

			idx_t n = 1;
			const auto last_idx = WindowBoundariesState::FindPrevStart(ignore_nulls, frame.start, frame.end, n);
			if (!n) {
				cursor.CopyCell(0, last_idx, result, i);
				return;
			}
		}

		// Didn't find one
		FlatVector::SetNull(result, i, true);
	});
}